

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O2

int quicly_local_cid_set_size(quicly_local_cid_set_t *set,size_t size)

{
  uint __line;
  int iVar1;
  ulong uVar2;
  quicly_local_cid_t *pqVar3;
  char *__assertion;
  size_t i;
  size_t idx;
  quicly_local_cid_t *pqVar4;
  int iVar5;
  
  if (size < 5) {
    uVar2 = set->_size;
    if (uVar2 <= size) {
      pqVar4 = set->cids;
      pqVar3 = set->cids + uVar2;
      for (; size != uVar2; uVar2 = uVar2 + 1) {
        pqVar3->state = QUICLY_LOCAL_CID_STATE_IDLE;
        pqVar3 = pqVar3 + 1;
      }
      set->_size = size;
      iVar5 = 0;
      idx = 0;
      do {
        if (size == idx) {
          return iVar5;
        }
        if (pqVar4->state == QUICLY_LOCAL_CID_STATE_IDLE) {
          iVar1 = generate_cid(set,idx);
          if (iVar1 == 0) {
            return iVar5;
          }
          do_mark_pending(set,idx);
          iVar5 = 1;
        }
        idx = idx + 1;
        pqVar4 = pqVar4 + 1;
      } while( true );
    }
    __assertion = "set->_size <= size";
    __line = 0x6b;
  }
  else {
    __assertion = "size <= PTLS_ELEMENTSOF(set->cids)";
    __line = 0x6a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                ,__line,"int quicly_local_cid_set_size(quicly_local_cid_set_t *, size_t)");
}

Assistant:

int quicly_local_cid_set_size(quicly_local_cid_set_t *set, size_t size)
{
    int is_pending = 0;

    assert(size <= PTLS_ELEMENTSOF(set->cids));
    assert(set->_size <= size);

    for (size_t i = set->_size; i < size; i++)
        set->cids[i].state = QUICLY_LOCAL_CID_STATE_IDLE;

    set->_size = size;

    /* First we prepare N CIDs (to be precise here we prepare N-1, as we already had one upon initialization).
     * Later, every time one of the CIDs is retired, we immediately prepare one additional CID
     * to always fill the CID list. */
    for (size_t i = 0; i < size; i++) {
        if (set->cids[i].state != QUICLY_LOCAL_CID_STATE_IDLE)
            continue;

        if (!generate_cid(set, i))
            break;
        do_mark_pending(set, i);
        is_pending = 1;
    }

    return is_pending;
}